

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_member_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *type_00;
  mapped_type *pmVar4;
  Vector<Decoration> *this_00;
  uint *puVar5;
  uint *ts_1;
  ulong uVar6;
  Decoration *pDVar7;
  byte local_31;
  Vector<Decoration> *memb;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  memb._4_4_ = index;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->type_alias);
  TypedID<(spirv_cross::Types)1>::TypedID((TypedID<(spirv_cross::Types)1> *)&memb,0);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&memb);
  local_31 = 0;
  if (uVar2 != uVar3) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_20->type_alias);
    bVar1 = Compiler::has_extended_decoration
                      (&this->super_Compiler,uVar2,SPIRVCrossDecorationBufferBlockRepacked);
    local_31 = bVar1 ^ 0xff;
  }
  if ((local_31 & 1) == 0) {
    pmVar4 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&(pSStack_20->super_IVariant).self);
    this_00 = &pmVar4->members;
    puVar5 = (uint *)(ulong)memb._4_4_;
    ts_1 = (uint *)VectorView<spirv_cross::Meta::Decoration>::size
                             (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
    if (puVar5 < ts_1) {
      VectorView<spirv_cross::Meta::Decoration>::operator[]
                (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)memb._4_4_);
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pDVar7 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                           (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,
                            (ulong)memb._4_4_);
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pDVar7);
        return __return_storage_ptr__;
      }
    }
    join<char_const(&)[3],unsigned_int&>
              (__return_storage_ptr__,(spirv_cross *)0x5a8cf0,(char (*) [3])((long)&memb + 4),ts_1);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_20->type_alias);
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    to_member_name_abi_cxx11_(__return_storage_ptr__,this,type_00,memb._4_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_member_name(const SPIRType &type, uint32_t index)
{
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
	{
		return to_member_name(get<SPIRType>(type.type_alias), index);
	}

	auto &memb = ir.meta[type.self].members;
	if (index < memb.size() && !memb[index].alias.empty())
		return memb[index].alias;
	else
		return join("_m", index);
}